

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zMaster)

{
  BtShared *pBt;
  Pager *pPVar1;
  u8 *puVar2;
  int iVar3;
  Pgno PVar4;
  u32 nFree;
  Pgno pgno;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (pBt->autoVacuum != '\0') {
    pPVar1 = pBt->pPager;
    invalidateAllOverflowCache(pBt);
    if (pBt->incrVacuum == '\0') {
      pgno = pBt->nPage;
      PVar4 = ptrmapPageno(pBt,pgno);
      if ((PVar4 == pgno) || (pgno == (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
        iVar3 = 0xcdfe;
      }
      else {
        nFree = sqlite3Get4byte(pBt->pPage1->aData + 0x24);
        PVar4 = finalDbSize(pBt,pgno,nFree);
        if (PVar4 <= pgno) {
          iVar3 = 0;
          if (PVar4 < pgno) {
            iVar3 = saveAllCursors(pBt,0,(BtCursor *)0x0);
          }
          while ((PVar4 < pgno && (iVar3 == 0))) {
            iVar3 = incrVacuumStep(pBt,PVar4,pgno,1);
            pgno = pgno - 1;
          }
          if ((nFree != 0) && (iVar3 == 0x65 || iVar3 == 0)) {
            iVar3 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            puVar2 = pBt->pPage1->aData;
            puVar2[0x20] = '\0';
            puVar2[0x21] = '\0';
            puVar2[0x22] = '\0';
            puVar2[0x23] = '\0';
            puVar2 = pBt->pPage1->aData;
            puVar2[0x24] = '\0';
            puVar2[0x25] = '\0';
            puVar2[0x26] = '\0';
            puVar2[0x27] = '\0';
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 PVar4 >> 0x18 | (PVar4 & 0xff0000) >> 8 | (PVar4 & 0xff00) << 8 | PVar4 << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = PVar4;
          }
          if (iVar3 != 0) {
            sqlite3PagerRollback(pPVar1);
            goto LAB_00137d48;
          }
          goto LAB_00137cf6;
        }
        iVar3 = 0xce03;
      }
      sqlite3CorruptError(iVar3);
      iVar3 = 0xb;
      goto LAB_00137d48;
    }
  }
LAB_00137cf6:
  pPVar1 = pBt->pPager;
  if (pBt->bDoTruncate != '\0') {
    pPVar1->dbSize = pBt->nPage;
  }
  iVar3 = sqlite3PagerCommitPhaseOne(pPVar1,zMaster,0);
LAB_00137d48:
  sqlite3BtreeLeave(p);
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zMaster){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(pBt);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zMaster, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}